

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-kalman-filter.cpp
# Opt level: O1

MeasureVector __thiscall
stateObservation::LinearKalmanFilter::simulateSensor_
          (LinearKalmanFilter *this,StateVector *x,uint k)

{
  Cmatrix *pCVar1;
  double *pdVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  double *pdVar6;
  long lVar7;
  bool bVar8;
  uint in_ECX;
  char *pcVar9;
  undefined4 in_register_00000014;
  Matrix<double,__1,_1,_0,__1,_1> *rhs;
  Index extraout_RDX;
  Index extraout_RDX_00;
  ActualDstType actualDst;
  Index IVar10;
  void *pvVar11;
  long lVar12;
  double *pdVar13;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar14;
  MeasureVector MVar15;
  assign_op<double,_double> local_81;
  Index *local_80;
  Cmatrix *local_78;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  local_70;
  void *local_48;
  double *local_40;
  long local_38;
  
  rhs = (Matrix<double,__1,_1,_0,__1,_1> *)CONCAT44(in_register_00000014,k);
  pCVar1 = (Cmatrix *)(x + 0x10);
  bVar8 = KalmanFilterBase::checkCmatrix((KalmanFilterBase *)x,pCVar1);
  if (!bVar8) {
    __assert_fail("checkCmatrix(c_) && \"ERROR: The C is not initialized\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/linear-kalman-filter.cpp"
                  ,0x39,
                  "virtual ObserverBase::MeasureVector stateObservation::LinearKalmanFilter::simulateSensor_(const StateVector &, unsigned int)"
                 );
  }
  uVar4 = *(uint *)((long)&(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_rows + 4);
  local_78 = pCVar1;
  if ((uVar4 != *(uint *)&x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data) ||
     (uVar5 = *(uint *)&x[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data, pMVar14 = (Matrix<double,__1,_1,_0,__1,_1> *)(ulong)uVar5,
     uVar5 != (uint)x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_rows)) {
    __assert_fail("checkDmatrix(d_) && \"ERROR: The D is not initialized\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/linear-kalman-filter.cpp"
                  ,0x3a,
                  "virtual ObserverBase::MeasureVector stateObservation::LinearKalmanFilter::simulateSensor_(const StateVector &, unsigned int)"
                 );
  }
  local_80 = &x[0x26].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
  if (pMVar14 == (Matrix<double,__1,_1,_0,__1,_1> *)0x0) {
    bVar8 = false;
  }
  else {
    local_70.m_rhs.m_lhs = (LhsNested)0x0;
    local_70.m_lhs.m_lhs = (Cmatrix *)(ulong)uVar4;
    local_70.m_lhs.m_rhs = pMVar14;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_48,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_70);
    pdVar6 = x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
    ;
    if ((pdVar6 != local_40) ||
       (x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
        local_38)) {
      pcVar9 = 
      "Eigen::CwiseBinaryOp<Eigen::numext::not_equal_to<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::numext::not_equal_to<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
      ;
      goto LAB_0013b560;
    }
    bVar8 = 0 < local_38;
    if (0 < local_38) {
      IVar10 = *local_80;
      bVar8 = true;
      lVar12 = 0;
      pvVar11 = local_48;
      do {
        if (0 < (long)local_40) {
          pdVar13 = (double *)0x0;
          do {
            dVar3 = *(double *)(IVar10 + (long)pdVar13 * 8);
            pdVar2 = (double *)((long)pvVar11 + (long)pdVar13 * 8);
            if ((dVar3 != *pdVar2) || (NAN(dVar3) || NAN(*pdVar2))) goto LAB_0013b232;
            pdVar13 = (double *)((long)pdVar13 + 1);
          } while (local_40 != pdVar13);
        }
        lVar12 = lVar12 + 1;
        pvVar11 = (void *)((long)pvVar11 + (long)local_40 * 8);
        IVar10 = IVar10 + (long)pdVar6 * 8;
        bVar8 = lVar12 < local_38;
      } while (lVar12 != local_38);
    }
  }
LAB_0013b232:
  if (pMVar14 != (Matrix<double,__1,_1,_0,__1,_1> *)0x0) {
    free(local_48);
  }
  pCVar1 = local_78;
  if (bVar8) {
    pdVar6 = x[0xe].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    lVar12 = (x[0xb].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              - x[10].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows >> 3) * -0x5555555555555555 +
             (x[0xc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              - (long)x[0xd].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data >> 3) * -0x5555555555555555 +
             (((long)pdVar6 -
               (long)x[0xc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_data >> 3) + -1 + (ulong)(pdVar6 == (double *)0x0)) * 0x15;
    if (((lVar12 == 0) ||
        (uVar4 = *(uint *)&x[9].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data, in_ECX < uVar4)) ||
       ((ulong)uVar4 + lVar12 <= (ulong)in_ECX)) {
      __assert_fail("u_.checkIndex(k) && \"ERROR: The input feedthrough of the measurements is not set                              (the measurement at time k needs the input at time k which was not given)                              if you don\'t need the input in the computation of measurement, you                              must set D matrix to zero\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/linear-kalman-filter.cpp"
                    ,0x42,
                    "virtual ObserverBase::MeasureVector stateObservation::LinearKalmanFilter::simulateSensor_(const StateVector &, unsigned int)"
                   );
    }
    if (x[0x11].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
        (double *)
        (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      if (lVar12 == 0) {
LAB_0013b4cf:
        __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                      ,0x9b,"void stateObservation::IndexedMatrixArray::check_(unsigned int) const")
        ;
      }
      uVar4 = *(uint *)&x[9].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data;
      if ((in_ECX < uVar4) || (lVar12 + (ulong)uVar4 <= (ulong)in_ECX)) goto LAB_0013b4cf;
      local_70.m_rhs.m_rhs =
           std::
           _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
           ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                         *)&x[10].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows,(ulong)(in_ECX - uVar4));
      if (x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
          ((local_70.m_rhs.m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows) {
        local_70.m_lhs.m_lhs = local_78;
        local_70.m_rhs.m_lhs = (LhsNested)local_80;
        pdVar6 = x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        local_70.m_lhs.m_rhs = rhs;
        if (((double *)
             x[0x10].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             != pdVar6) ||
           (((local_70.m_rhs.m_rhs)->
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 1)
           ) {
          pcVar9 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>]"
          ;
LAB_0013b560:
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar9);
        }
        (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase
             = (_func_int **)0x0;
        (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.n_ = 0;
        (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.m_ = 0;
        if ((long)pdVar6 < 0) goto LAB_0013b4ee;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                  ((DenseStorage<double,__1,__1,_1,_0> *)this,(Index)pdVar6,(Index)pdVar6,1);
        Eigen::internal::
        assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
        ::
        run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)this,&local_70,&local_81);
        IVar10 = extraout_RDX;
        goto LAB_0013b42f;
      }
      pcVar9 = 
      "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
      ;
      goto LAB_0013b541;
    }
  }
  else if (x[0x11].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           == (double *)
              (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
          ) {
    (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase =
         (_func_int **)0x0;
    (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.n_ = 0;
    (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.m_ = 0;
    lVar12 = x[0x10].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
    ;
    lVar7._0_4_ = (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.n_;
    lVar7._4_4_ = (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.m_;
    if (lVar7 != lVar12) {
      if (lVar12 < 0) {
LAB_0013b4ee:
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)this,lVar12,lVar12,1);
    }
    lVar12._0_4_ = (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.n_;
    lVar12._4_4_ = (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.m_;
    if (lVar12 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (lVar12 != 0) {
      memset((this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.
             _vptr_ObserverBase,0,lVar12 << 3);
    }
    local_70.m_lhs.m_lhs = (LhsNested)&DAT_3ff0000000000000;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)this,pCVar1,rhs,(Scalar *)&local_70);
    IVar10 = extraout_RDX_00;
LAB_0013b42f:
    MVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar10;
    MVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (MeasureVector)
           MVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  pcVar9 = 
  "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
  ;
LAB_0013b541:
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar9);
}

Assistant:

ObserverBase::MeasureVector LinearKalmanFilter::simulateSensor_(const StateVector& x, unsigned k)
    {

        BOOST_ASSERT(checkCmatrix(c_) && "ERROR: The C is not initialized");
        BOOST_ASSERT(checkDmatrix(d_) && "ERROR: The D is not initialized");

        if (p_>0 && d_!=getDmatrixZero())
        {
                BOOST_ASSERT(u_.checkIndex(k) &&
                             "ERROR: The input feedthrough of the measurements is not set \
                             (the measurement at time k needs the input at time k which was not given) \
                             if you don't need the input in the computation of measurement, you \
                             must set D matrix to zero");
                return c_*x+d_*u_[k];

        }
        else
        {
            return ObserverBase::MeasureVector(c_*x);
        }

    }